

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall fast_float::bigint::pow5(bigint *this,uint32_t exp)

{
  bool bVar1;
  size_t in_RCX;
  limb_span y;
  limb max_native;
  uint32_t small_step;
  undefined1 local_38 [8];
  limb_span large;
  size_t large_length;
  uint32_t exp_local;
  bigint *this_local;
  
  large.length = 5;
  span<unsigned_long>::span
            ((span<unsigned_long> *)local_38,(unsigned_long *)pow5_tables<void>::large_power_of_5,5)
  ;
  for (large_length._4_4_ = exp; 0x86 < large_length._4_4_;
      large_length._4_4_ = large_length._4_4_ - 0x87) {
    y.length = in_RCX;
    y.ptr = large.ptr;
    bVar1 = large_mul<(unsigned_short)62>
                      ((fast_float *)this,(stackvec<(unsigned_short)62> *)local_38,y);
    if (!bVar1) {
      return false;
    }
  }
  while( true ) {
    if (large_length._4_4_ < 0x1b) {
      if ((large_length._4_4_ == 0) ||
         (bVar1 = small_mul<(unsigned_short)62>
                            (&this->vec,
                             *(limb *)(pow5_tables<void>::small_power_of_5 +
                                      (ulong)large_length._4_4_ * 8)), bVar1)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    bVar1 = small_mul<(unsigned_short)62>(&this->vec,0x6765c793fa10079d);
    if (!bVar1) break;
    large_length._4_4_ = large_length._4_4_ - 0x1b;
  }
  return false;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool pow5(uint32_t exp) noexcept {
    // multiply by a power of 5
    size_t large_length = sizeof(large_power_of_5) / sizeof(limb);
    limb_span large = limb_span(large_power_of_5, large_length);
    while (exp >= large_step) {
      FASTFLOAT_TRY(large_mul(vec, large));
      exp -= large_step;
    }
#ifdef FASTFLOAT_64BIT_LIMB
    uint32_t small_step = 27;
    limb max_native = 7450580596923828125UL;
#else
    uint32_t small_step = 13;
    limb max_native = 1220703125U;
#endif
    while (exp >= small_step) {
      FASTFLOAT_TRY(small_mul(vec, max_native));
      exp -= small_step;
    }
    if (exp != 0) {
      // Work around clang bug https://godbolt.org/z/zedh7rrhc
      // This is similar to https://github.com/llvm/llvm-project/issues/47746,
      // except the workaround described there don't work here
      FASTFLOAT_TRY(
        small_mul(vec, limb(((void)small_power_of_5[0], small_power_of_5[exp])))
      );
    }

    return true;
  }